

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  secp256k1_modinv64_signed62 *psVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint len;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar14;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_modinfo *local_118;
  secp256k1_modinv64_signed62 *local_110;
  secp256k1_modinv64_signed62 local_108;
  secp256k1_modinv64_trans2x2 local_d8;
  secp256k1_modinv64_signed62 local_b8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  ulong uVar13;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[4] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  local_b8.v[4] = (modinfo->modulus).v[4];
  local_b8.v[0] = (modinfo->modulus).v[0];
  local_b8.v[1] = (modinfo->modulus).v[1];
  local_b8.v[2] = (modinfo->modulus).v[2];
  local_b8.v[3] = (modinfo->modulus).v[3];
  local_108.v[4] = x->v[4];
  local_108.v[0] = x->v[0];
  local_108.v[1] = x->v[1];
  local_108.v[2] = x->v[2];
  local_108.v[3] = x->v[3];
  len = 5;
  lVar14 = -1;
  local_118 = modinfo;
  local_110 = x;
  do {
    lVar3 = 0;
    if ((local_108.v[0] | 0xc000000000000000U) != 0) {
      for (; ((local_108.v[0] | 0xc000000000000000U) >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    lVar14 = lVar14 - lVar3;
    if (lVar3 == 0x3e) {
      local_d8.r = 1;
      local_d8.q = 0;
      local_d8.u = 0x4000000000000000;
      local_d8.v = 0;
    }
    else {
      local_d8.r = 1;
      local_d8.u = 1L << ((byte)lVar3 & 0x3f);
      uVar9 = (ulong)local_108.v[0] >> ((byte)lVar3 & 0x3f);
      iVar2 = 0x3e - (int)lVar3;
      local_d8.v = 0;
      local_d8.q = 0;
      uVar7 = local_b8.v[0];
      do {
        iVar11 = (int)uVar9;
        bVar5 = (byte)iVar2;
        if (lVar14 < 0) {
          lVar14 = -lVar14;
          uVar10 = -uVar7;
          lVar8 = -local_d8.u;
          lVar3 = -local_d8.v;
          iVar6 = (int)lVar14 + 1;
          bVar4 = (byte)iVar6;
          if (iVar2 <= iVar6) {
            bVar4 = bVar5;
          }
          uVar12 = (uint)(0xffffffffffffffff >> (-bVar4 & 0x3f)) &
                   (iVar11 * iVar11 + 0x3e) * iVar11 * (int)uVar10 & 0x3f;
          local_d8.u = local_d8.q;
          uVar7 = uVar9;
        }
        else {
          iVar6 = (int)lVar14 + 1;
          bVar4 = (byte)iVar6;
          if (iVar2 <= iVar6) {
            bVar4 = bVar5;
          }
          uVar12 = (uint)(0xffffffffffffffff >> (-bVar4 & 0x3f)) &
                   -((((int)uVar7 * 2 + 2U & 8) + (int)uVar7) * iVar11) & 0xf;
          lVar3 = local_d8.r;
          uVar10 = uVar9;
          local_d8.r = local_d8.v;
          lVar8 = local_d8.q;
        }
        uVar13 = (ulong)uVar12;
        uVar10 = uVar13 * uVar7 + uVar10;
        local_d8.q = local_d8.u * uVar13 + lVar8;
        uVar9 = -1L << (bVar5 & 0x3f) | uVar10;
        lVar8 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        bVar5 = (byte)lVar8;
        uVar9 = uVar10 >> (bVar5 & 0x3f);
        local_d8.u = local_d8.u << (bVar5 & 0x3f);
        local_d8.v = local_d8.r << (bVar5 & 0x3f);
        local_d8.r = lVar3 + uVar13 * local_d8.r;
        lVar14 = lVar14 - lVar8;
        iVar2 = iVar2 - (int)lVar8;
      } while (iVar2 != 0);
    }
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_d8,local_118);
    secp256k1_modinv64_update_fg_62_var(len,&local_b8,&local_108,&local_d8);
    lVar3 = (long)(int)len;
    if (local_108.v[0] == 0) {
      if ((int)len < 2) {
LAB_0023d747:
        secp256k1_modinv64_normalize_62(&local_88,local_b8.v[lVar3 + -1],local_118);
        local_110->v[4] = local_88.v[4];
        local_110->v[2] = local_88.v[2];
        local_110->v[3] = local_88.v[3];
        local_110->v[0] = local_88.v[0];
        local_110->v[1] = local_88.v[1];
        return;
      }
      uVar7 = 1;
      uVar9 = 0;
      do {
        uVar9 = uVar9 | local_108.v[uVar7];
        uVar7 = uVar7 + 1;
      } while (len != uVar7);
      if (uVar9 == 0) goto LAB_0023d747;
    }
    lVar8 = local_b8.v[lVar3 + -1];
    psVar1 = (&local_110)[lVar3];
    if ((secp256k1_modinv64_signed62 *)((long)psVar1 >> 0x3f) == psVar1 &&
        (lVar8 >> 0x3f == lVar8 && -1 < lVar3 + -2)) {
      len = len - 1;
      local_b8.v[lVar3 + -2] = local_b8.v[lVar3 + -2] | lVar8 << 0x3e;
      (&local_118)[lVar3] =
           (secp256k1_modinv64_modinfo *)((ulong)(&local_118)[lVar3] | (long)psVar1 << 0x3e);
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }

        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0)));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}